

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFactored
          (FBXConverter *this,PropertyTable *props,string *colorName,string *factorName,bool *result
          ,bool useTemplate)

{
  float fVar1;
  PropertyTable *pPVar2;
  Property *pPVar3;
  long lVar4;
  undefined7 in_register_00000089;
  float in_XMM1_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  aiColor3D aVar8;
  char in_stack_00000008;
  
  *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 1;
  pPVar3 = PropertyTable::Get((PropertyTable *)colorName,factorName);
  if (((pPVar3 == (Property *)0x0) &&
      (((in_stack_00000008 == '\0' ||
        (pPVar2 = (PropertyTable *)colorName[3]._M_dataplus._M_p, pPVar2 == (PropertyTable *)0x0))
       || (pPVar3 = PropertyTable::Get(pPVar2,factorName), pPVar3 == (Property *)0x0)))) ||
     (lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                             0), lVar4 == 0)) {
    *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 0;
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar7 = 0.0;
  }
  else {
    fVar5 = (float)*(undefined8 *)(lVar4 + 8);
    fVar6 = (float)((ulong)*(undefined8 *)(lVar4 + 8) >> 0x20);
    fVar7 = *(float *)(lVar4 + 0x10);
    if (((*(long *)(result + 8) != 0) &&
        ((pPVar3 = PropertyTable::Get((PropertyTable *)colorName,(string *)result),
         pPVar3 != (Property *)0x0 ||
         (((in_stack_00000008 != '\0' &&
           (pPVar2 = (PropertyTable *)colorName[3]._M_dataplus._M_p, pPVar2 != (PropertyTable *)0x0)
           ) && (pPVar3 = PropertyTable::Get(pPVar2,(string *)result), pPVar3 != (Property *)0x0))))
        )) && (lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0),
              lVar4 != 0)) {
      fVar1 = *(float *)(lVar4 + 8);
      fVar7 = fVar7 * fVar1;
      fVar5 = fVar5 * fVar1;
      fVar6 = fVar6 * fVar1;
      in_XMM1_Da = fVar5;
    }
  }
  *(ulong *)this = CONCAT44(fVar6,fVar5);
  *(float *)&(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start = fVar7;
  aVar8.g = fVar6;
  aVar8.r = fVar5;
  aVar8.b = in_XMM1_Da;
  return aVar8;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFactored(const PropertyTable& props, const std::string& colorName,
            const std::string& factorName, bool& result, bool useTemplate)
        {
            result = true;

            bool ok;
            aiVector3D BaseColor = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }

            // if no factor name, return the colour as is
            if (factorName.empty()) {
                return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
            }

            // otherwise it should be multiplied by the factor, if found.
            float factor = PropertyGet<float>(props, factorName, ok, useTemplate);
            if (ok) {
                BaseColor *= factor;
            }
            return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
        }